

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O0

unsigned_long jsonnet::internal::jsonnet_string_parse_unicode(LocationRange *loc,char32_t *c)

{
  uint uVar1;
  undefined8 uVar2;
  StaticError *this;
  LocationRange *location;
  string *msg_00;
  long in_RSI;
  allocator<char> *in_RDI;
  stringstream ss;
  char *msg;
  uint digit;
  uchar x;
  uint i;
  unsigned_long codepoint;
  string *in_stack_fffffffffffffdb0;
  LocationRange *in_stack_fffffffffffffdb8;
  StaticError *in_stack_fffffffffffffdc0;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  stringstream local_1f0 [16];
  ostream local_1e0 [379];
  undefined1 local_65;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_51;
  char *local_30;
  uint local_24;
  byte local_1d;
  uint local_1c;
  unsigned_long local_18;
  allocator<char> *local_8;
  
  local_18 = 0;
  local_1c = 0;
  while( true ) {
    if (3 < local_1c) {
      return local_18;
    }
    uVar1 = *(uint *)(in_RSI + (ulong)local_1c * 4);
    local_1d = (byte)uVar1;
    if (local_1d == 0) break;
    if ((local_1d < 0x30) || (0x39 < local_1d)) {
      if ((local_1d < 0x61) || (0x66 < local_1d)) {
        if ((local_1d < 0x41) || (0x46 < local_1d)) {
          std::__cxx11::stringstream::stringstream(local_1f0);
          this = (StaticError *)std::operator<<(local_1e0,"Malformed unicode escape character, ");
          location = (LocationRange *)std::operator<<((ostream *)this,"should be hex: \'");
          msg_00 = (string *)std::operator<<((ostream *)location,local_1d);
          std::operator<<((ostream *)msg_00,"\'");
          uVar2 = __cxa_allocate_exception(0x60);
          std::__cxx11::stringstream::str();
          StaticError::StaticError(this,location,msg_00);
          __cxa_throw(uVar2,&StaticError::typeinfo,StaticError::~StaticError);
        }
        local_24 = (uVar1 & 0xff) - 0x37;
      }
      else {
        local_24 = (uVar1 & 0xff) - 0x57;
      }
    }
    else {
      local_24 = (uVar1 & 0xff) - 0x30;
    }
    local_18 = (ulong)local_24 + local_18 * 0x10;
    local_1c = local_1c + 1;
  }
  local_30 = "Truncated unicode escape sequence in string literal.";
  local_65 = 1;
  local_8 = in_RDI;
  uVar2 = __cxa_allocate_exception(0x60);
  this_00 = &local_51;
  __s = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,__s,local_8);
  StaticError::StaticError
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  local_65 = 0;
  __cxa_throw(uVar2,&StaticError::typeinfo,StaticError::~StaticError);
}

Assistant:

unsigned long jsonnet_string_parse_unicode(const LocationRange &loc, const char32_t *c)
{
    unsigned long codepoint = 0;
    // Expect 4 hex digits.
    for (unsigned i = 0; i < 4; ++i) {
        auto x = (unsigned char)(c[i]);
        unsigned digit;
        if (x == '\0') {
            auto msg = "Truncated unicode escape sequence in string literal.";
            throw StaticError(loc, msg);
        } else if (x >= '0' && x <= '9') {
            digit = x - '0';
        } else if (x >= 'a' && x <= 'f') {
            digit = x - 'a' + 10;
        } else if (x >= 'A' && x <= 'F') {
            digit = x - 'A' + 10;
        } else {
            std::stringstream ss;
            ss << "Malformed unicode escape character, "
               << "should be hex: '" << x << "'";
            throw StaticError(loc, ss.str());
        }
        codepoint *= 16;
        codepoint += digit;
    }
    return codepoint;
}